

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O2

void fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
               (uint64_t *out1,fiat_id_tc26_gost_3410_2012_512_paramSetA_uint1 arg1,uint64_t *arg2,
               uint64_t *arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  undefined7 in_register_00000031;
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  
  uVar14 = -(ulong)((int)CONCAT71(in_register_00000031,arg1) != 0);
  uVar15 = ~uVar14;
  auVar16._8_4_ = (int)uVar14;
  auVar16._0_8_ = uVar14;
  auVar16._12_4_ = (int)(uVar14 >> 0x20);
  auVar1 = *(undefined1 (*) [16])(arg3 + 2);
  auVar2 = *(undefined1 (*) [16])(arg3 + 4);
  auVar3 = *(undefined1 (*) [16])(arg3 + 6);
  uVar17 = (undefined4)uVar15;
  uVar18 = (undefined4)(uVar15 >> 0x20);
  auVar4 = *(undefined1 (*) [16])(arg2 + 2);
  auVar5 = *(undefined1 (*) [16])(arg2 + 4);
  auVar6 = *(undefined1 (*) [16])(arg2 + 6);
  auVar9._8_4_ = uVar17;
  auVar9._0_8_ = uVar15;
  auVar9._12_4_ = uVar18;
  auVar10._8_4_ = uVar17;
  auVar10._0_8_ = uVar15;
  auVar10._12_4_ = uVar18;
  auVar11._8_4_ = uVar17;
  auVar11._0_8_ = uVar15;
  auVar11._12_4_ = uVar18;
  auVar12._8_4_ = uVar17;
  auVar12._0_8_ = uVar15;
  auVar12._12_4_ = uVar18;
  auVar7 = *(undefined1 (*) [16])(arg2 + 8);
  auVar8 = *(undefined1 (*) [16])(arg3 + 8);
  auVar13._8_4_ = uVar17;
  auVar13._0_8_ = uVar15;
  auVar13._12_4_ = uVar18;
  *(undefined1 (*) [16])out1 =
       *(undefined1 (*) [16])arg2 & auVar9 | *(undefined1 (*) [16])arg3 & auVar16;
  *(undefined1 (*) [16])(out1 + 2) = auVar4 & auVar10 | auVar1 & auVar16;
  *(undefined1 (*) [16])(out1 + 4) = auVar5 & auVar11 | auVar2 & auVar16;
  *(undefined1 (*) [16])(out1 + 6) = auVar6 & auVar12 | auVar3 & auVar16;
  *(undefined1 (*) [16])(out1 + 8) = auVar7 & auVar13 | auVar8 & auVar16;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetA_cmovznz_u64(
    uint64_t *out1, fiat_id_tc26_gost_3410_2012_512_paramSetA_uint1 arg1,
    uint64_t arg2, uint64_t arg3) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_uint1 x1;
    uint64_t x2;
    uint64_t x3;
    x1 = (!(!arg1));
    x2 = ((fiat_id_tc26_gost_3410_2012_512_paramSetA_int1)(0x0 - x1) &
          UINT64_C(0xffffffffffffffff));
    x3 = ((fiat_id_tc26_gost_3410_2012_512_paramSetA_value_barrier_u64(x2) &
           arg3) |
          (fiat_id_tc26_gost_3410_2012_512_paramSetA_value_barrier_u64((~x2)) &
           arg2));
    *out1 = x3;
}